

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O3

void __thiscall
el::base::TypedConfigurations::build(TypedConfigurations *this,Configurations *configurations)

{
  ConfigurationType CVar1;
  Level LVar2;
  pointer pcVar3;
  long lVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  unsigned_long uVar7;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined8 uVar8;
  _Alloc_hider _Var9;
  TypedConfigurations *pTVar10;
  Configuration **ppCVar11;
  bool bVar12;
  vector<el::Configuration_*,_std::allocator<el::Configuration_*>_> withFileSizeLimit;
  Configuration *conf;
  Configuration **local_248;
  iterator iStack_240;
  Configuration **local_238;
  Configuration *local_230;
  string local_228;
  undefined1 local_208 [32];
  undefined1 local_1e8 [32];
  string local_1c8;
  undefined1 local_1a8 [32];
  undefined1 local_188 [32];
  undefined1 local_168 [32];
  undefined1 local_148 [32];
  _Base_ptr local_128;
  _Base_ptr local_120;
  _Base_ptr local_118;
  _Base_ptr local_110;
  _Base_ptr local_108;
  _Base_ptr local_100;
  _Base_ptr local_f8;
  _Base_ptr local_f0;
  _Any_data local_e8;
  _Alloc_hider local_d8;
  code *local_d0;
  long *plVar6;
  
  (*(this->super_ThreadSafe)._vptr_ThreadSafe[2])();
  local_248 = (Configuration **)0x0;
  iStack_240._M_current = (Configuration **)0x0;
  local_238 = (Configuration **)0x0;
  iVar5 = (*(configurations->super_RegistryWithPred<el::Configuration,_el::Configuration::Predicate>
            ).
            super_AbstractRegistry<el::Configuration,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
            .super_ThreadSafe._vptr_ThreadSafe[5])(configurations);
  plVar6 = (long *)CONCAT44(extraout_var,iVar5);
  local_110 = (_Base_ptr)&this->m_maxLogFileSizeMap;
  local_118 = (_Base_ptr)&this->m_performanceTrackingMap;
  local_120 = (_Base_ptr)&this->m_subsecondPrecisionMap;
  local_f0 = (_Base_ptr)&this->m_logFormatMap;
  local_128 = (_Base_ptr)&this->m_logFlushThresholdMap;
  local_f8 = (_Base_ptr)&this->m_toStandardOutputMap;
  local_100 = (_Base_ptr)&this->m_toFileMap;
  local_108 = (_Base_ptr)&this->m_enabledMap;
  do {
    iVar5 = (*(configurations->
              super_RegistryWithPred<el::Configuration,_el::Configuration::Predicate>).
              super_AbstractRegistry<el::Configuration,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
              .super_ThreadSafe._vptr_ThreadSafe[6])(configurations);
    if (plVar6 == (long *)CONCAT44(extraout_var_00,iVar5)) {
      iVar5 = (*(configurations->
                super_RegistryWithPred<el::Configuration,_el::Configuration::Predicate>).
                super_AbstractRegistry<el::Configuration,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
                .super_ThreadSafe._vptr_ThreadSafe[5])(configurations);
      for (plVar6 = (long *)CONCAT44(extraout_var_01,iVar5);
          iVar5 = (*(configurations->
                    super_RegistryWithPred<el::Configuration,_el::Configuration::Predicate>).
                    super_AbstractRegistry<el::Configuration,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
                    .super_ThreadSafe._vptr_ThreadSafe[6])(configurations),
          plVar6 != (long *)CONCAT44(extraout_var_02,iVar5); plVar6 = plVar6 + 1) {
        lVar4 = *plVar6;
        if (*(int *)(lVar4 + 0xc) == 0x10) {
          insertFile(this,*(Level *)(lVar4 + 8),(string *)(lVar4 + 0x10));
        }
      }
      if (local_248 != iStack_240._M_current) {
        ppCVar11 = local_248;
        do {
          local_e8._8_8_ = (_Base_ptr)0x0;
          local_e8._M_unused._M_object = defaultPreRollOutCallback;
          local_d0 = utils::std::
                     _Function_handler<void_(const_char_*,_unsigned_long),_void_(*)(const_char_*,_unsigned_long)>
                     ::_M_invoke;
          local_d8._M_p =
               (pointer)utils::std::
                        _Function_handler<void_(const_char_*,_unsigned_long),_void_(*)(const_char_*,_unsigned_long)>
                        ::_M_manager;
          unsafeValidateFileRolling(this,(*ppCVar11)->m_level,(PreRollOutCallback *)&local_e8);
          if ((code *)local_d8._M_p != (code *)0x0) {
            (*(code *)local_d8._M_p)
                      ((PreRollOutCallback *)&local_e8,(PreRollOutCallback *)&local_e8,3);
          }
          ppCVar11 = ppCVar11 + 1;
        } while (ppCVar11 != iStack_240._M_current);
      }
      if (local_248 != (Configuration **)0x0) {
        operator_delete(local_248,(long)local_238 - (long)local_248);
      }
      return;
    }
    local_230 = (Configuration *)*plVar6;
    CVar1 = local_230->m_configurationType;
    if ((int)CVar1 < 0x20) {
      switch(CVar1) {
      case Enabled:
        LVar2 = local_230->m_level;
        local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
        pcVar3 = (local_230->m_value)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1c8,pcVar3,pcVar3 + (local_230->m_value)._M_string_length);
        utils::Str::rtrim(&local_1c8);
        utils::Str::ltrim(&local_1c8);
        iVar5 = std::__cxx11::string::compare((char *)&local_1c8);
        bVar12 = true;
        if ((iVar5 != 0) && (iVar5 = std::__cxx11::string::compare((char *)&local_1c8), iVar5 != 0))
        {
          iVar5 = std::__cxx11::string::compare((char *)&local_1c8);
          bVar12 = iVar5 == 0;
        }
        local_e8._M_pod_data[0] = bVar12;
        setValue<bool>(this,LVar2,(bool *)local_e8._M_pod_data,
                       (map<el::Level,_bool,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_bool>_>_>
                        *)local_108,true);
        uVar8 = local_1c8.field_2._M_allocated_capacity;
        _Var9._M_p = local_1c8._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
LAB_0013ab48:
          operator_delete(_Var9._M_p,
                          (ulong)((long)&(((Configurations *)uVar8)->
                                         super_RegistryWithPred<el::Configuration,_el::Configuration::Predicate>
                                         ).
                                         super_AbstractRegistry<el::Configuration,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
                                         .super_ThreadSafe._vptr_ThreadSafe + 1));
        }
        break;
      case ToFile:
        LVar2 = local_230->m_level;
        local_1e8._0_8_ = local_1e8 + 0x10;
        pcVar3 = (local_230->m_value)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_1e8,pcVar3,pcVar3 + (local_230->m_value)._M_string_length);
        utils::Str::rtrim((string *)local_1e8);
        utils::Str::ltrim((string *)local_1e8);
        iVar5 = std::__cxx11::string::compare(local_1e8);
        bVar12 = true;
        if ((iVar5 != 0) && (iVar5 = std::__cxx11::string::compare(local_1e8), iVar5 != 0)) {
          iVar5 = std::__cxx11::string::compare(local_1e8);
          bVar12 = iVar5 == 0;
        }
        local_e8._M_pod_data[0] = bVar12;
        setValue<bool>(this,LVar2,(bool *)local_e8._M_pod_data,
                       (map<el::Level,_bool,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_bool>_>_>
                        *)local_100,true);
        uVar8 = local_1e8._16_8_;
        _Var9._M_p = (pointer)local_1e8._0_8_;
        if ((_Base_ptr)local_1e8._0_8_ != (_Base_ptr)(local_1e8 + 0x10)) goto LAB_0013ab48;
        break;
      case ToStandardOutput:
        LVar2 = local_230->m_level;
        local_208._0_8_ = local_208 + 0x10;
        pcVar3 = (local_230->m_value)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_208,pcVar3,pcVar3 + (local_230->m_value)._M_string_length);
        utils::Str::rtrim((string *)local_208);
        utils::Str::ltrim((string *)local_208);
        iVar5 = std::__cxx11::string::compare(local_208);
        bVar12 = true;
        if ((iVar5 != 0) && (iVar5 = std::__cxx11::string::compare(local_208), iVar5 != 0)) {
          iVar5 = std::__cxx11::string::compare(local_208);
          bVar12 = iVar5 == 0;
        }
        local_e8._M_pod_data[0] = bVar12;
        setValue<bool>(this,LVar2,(bool *)local_e8._M_pod_data,
                       (map<el::Level,_bool,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_bool>_>_>
                        *)local_f8,true);
        uVar8 = local_208._16_8_;
        _Var9._M_p = (pointer)local_208._0_8_;
        if ((_Base_ptr)local_208._0_8_ != (_Base_ptr)(local_208 + 0x10)) goto LAB_0013ab48;
        break;
      case Format:
        LVar2 = local_230->m_level;
        pcVar3 = (local_230->m_value)._M_dataplus._M_p;
        local_148._0_8_ = local_148 + 0x10;
        std::__cxx11::string::
        _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                  ((string *)local_148,pcVar3,pcVar3 + (local_230->m_value)._M_string_length);
        LogFormat::LogFormat((LogFormat *)&local_e8,LVar2,(string_t *)local_148);
        setValue<el::base::LogFormat>
                  (this,LVar2,(LogFormat *)&local_e8,
                   (map<el::Level,_el::base::LogFormat,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_el::base::LogFormat>_>_>
                    *)local_f0,true);
        LogFormat::~LogFormat((LogFormat *)&local_e8);
        uVar8 = local_148._16_8_;
        _Var9._M_p = (pointer)local_148._0_8_;
        if ((_Base_ptr)local_148._0_8_ != (_Base_ptr)(local_148 + 0x10)) goto LAB_0013ab48;
      }
    }
    else if ((int)CVar1 < 0x80) {
      if (CVar1 == MillisecondsWidth) {
        local_168._0_8_ = local_168 + 0x10;
        pcVar3 = (local_230->m_value)._M_dataplus._M_p;
        pTVar10 = (TypedConfigurations *)local_168;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_168,pcVar3,pcVar3 + (local_230->m_value)._M_string_length);
        uVar7 = getULong(pTVar10,(string *)local_168);
        local_e8._0_4_ = (undefined4)uVar7;
        if (local_e8._0_4_ - 7 < 0xfffffffa) {
          local_e8._0_4_ = 3;
        }
        local_e8._4_4_ = 1000;
        if (local_e8._0_4_ - 4 < 3) {
          local_e8._4_4_ = *(undefined4 *)(&DAT_001a5fb0 + (ulong)(local_e8._0_4_ - 4) * 4);
        }
        setValue<el::base::SubsecondPrecision>
                  (this,Global,(SubsecondPrecision *)&local_e8,
                   (map<el::Level,_el::base::SubsecondPrecision,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_el::base::SubsecondPrecision>_>_>
                    *)local_120,true);
        uVar8 = local_168._16_8_;
        _Var9._M_p = (pointer)local_168._0_8_;
        if ((_Base_ptr)local_168._0_8_ != (_Base_ptr)(local_168 + 0x10)) goto LAB_0013ab48;
      }
      else if (CVar1 == PerformanceTracking) {
        local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
        pcVar3 = (local_230->m_value)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_228,pcVar3,pcVar3 + (local_230->m_value)._M_string_length);
        utils::Str::rtrim(&local_228);
        utils::Str::ltrim(&local_228);
        iVar5 = std::__cxx11::string::compare((char *)&local_228);
        bVar12 = true;
        if ((iVar5 != 0) && (iVar5 = std::__cxx11::string::compare((char *)&local_228), iVar5 != 0))
        {
          iVar5 = std::__cxx11::string::compare((char *)&local_228);
          bVar12 = iVar5 == 0;
        }
        local_e8._M_pod_data[0] = bVar12;
        setValue<bool>(this,Global,(bool *)local_e8._M_pod_data,
                       (map<el::Level,_bool,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_bool>_>_>
                        *)local_118,true);
        uVar8 = local_228.field_2._M_allocated_capacity;
        _Var9._M_p = local_228._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_228._M_dataplus._M_p != &local_228.field_2) goto LAB_0013ab48;
      }
    }
    else if (CVar1 == MaxLogFileSize) {
      LVar2 = local_230->m_level;
      local_188._0_8_ = local_188 + 0x10;
      pcVar3 = (local_230->m_value)._M_dataplus._M_p;
      pTVar10 = (TypedConfigurations *)local_188;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_188,pcVar3,pcVar3 + (local_230->m_value)._M_string_length);
      local_e8._M_unused._M_member_pointer = getULong(pTVar10,(string *)local_188);
      setValue<unsigned_long>
                (this,LVar2,(unsigned_long *)local_e8._M_pod_data,
                 (map<el::Level,_unsigned_long,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_unsigned_long>_>_>
                  *)local_110,true);
      if ((undefined1 *)local_188._0_8_ != local_188 + 0x10) {
        operator_delete((void *)local_188._0_8_,
                        (ulong)((long)&(((RegistryWithPred<el::Configuration,_el::Configuration::Predicate>
                                          *)local_188._16_8_)->
                                       super_AbstractRegistry<el::Configuration,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
                                       ).super_ThreadSafe._vptr_ThreadSafe + 1));
      }
      if (iStack_240._M_current == local_238) {
        std::vector<el::Configuration*,std::allocator<el::Configuration*>>::
        _M_realloc_insert<el::Configuration*const&>
                  ((vector<el::Configuration*,std::allocator<el::Configuration*>> *)&local_248,
                   iStack_240,&local_230);
      }
      else {
        *iStack_240._M_current = local_230;
        iStack_240._M_current = iStack_240._M_current + 1;
      }
    }
    else if (CVar1 == LogFlushThreshold) {
      LVar2 = local_230->m_level;
      local_1a8._0_8_ = local_1a8 + 0x10;
      pcVar3 = (local_230->m_value)._M_dataplus._M_p;
      pTVar10 = (TypedConfigurations *)local_1a8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_1a8,pcVar3,pcVar3 + (local_230->m_value)._M_string_length);
      local_e8._M_unused._M_member_pointer = getULong(pTVar10,(string *)local_1a8);
      setValue<unsigned_long>
                (this,LVar2,(unsigned_long *)local_e8._M_pod_data,
                 (map<el::Level,_unsigned_long,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_unsigned_long>_>_>
                  *)local_128,true);
      uVar8 = local_1a8._16_8_;
      _Var9._M_p = (pointer)local_1a8._0_8_;
      if ((_Base_ptr)local_1a8._0_8_ != (_Base_ptr)(local_1a8 + 0x10)) goto LAB_0013ab48;
    }
    plVar6 = plVar6 + 1;
  } while( true );
}

Assistant:

void TypedConfigurations::build(Configurations* configurations) {
  base::threading::ScopedLock scopedLock(lock());
  auto getBool = [] (std::string boolStr) -> bool {  // Pass by value for trimming
    base::utils::Str::trim(boolStr);
    return (boolStr == "TRUE" || boolStr == "true" || boolStr == "1");
  };
  std::vector<Configuration*> withFileSizeLimit;
  for (Configurations::const_iterator it = configurations->begin(); it != configurations->end(); ++it) {
    Configuration* conf = *it;
    // We cannot use switch on strong enums because Intel C++ dont support them yet
    if (conf->configurationType() == ConfigurationType::Enabled) {
      setValue(conf->level(), getBool(conf->value()), &m_enabledMap);
    } else if (conf->configurationType() == ConfigurationType::ToFile) {
      setValue(conf->level(), getBool(conf->value()), &m_toFileMap);
    } else if (conf->configurationType() == ConfigurationType::ToStandardOutput) {
      setValue(conf->level(), getBool(conf->value()), &m_toStandardOutputMap);
    } else if (conf->configurationType() == ConfigurationType::Filename) {
      // We do not yet configure filename but we will configure in another
      // loop. This is because if file cannot be created, we will force ToFile
      // to be false. Because configuring logger is not necessarily performance
      // sensative operation, we can live with another loop; (by the way this loop
      // is not very heavy either)
    } else if (conf->configurationType() == ConfigurationType::Format) {
      setValue(conf->level(), base::LogFormat(conf->level(),
                                              base::type::string_t(conf->value().begin(), conf->value().end())), &m_logFormatMap);
    } else if (conf->configurationType() == ConfigurationType::SubsecondPrecision) {
      setValue(Level::Global,
               base::SubsecondPrecision(static_cast<int>(getULong(conf->value()))), &m_subsecondPrecisionMap);
    } else if (conf->configurationType() == ConfigurationType::PerformanceTracking) {
      setValue(Level::Global, getBool(conf->value()), &m_performanceTrackingMap);
    } else if (conf->configurationType() == ConfigurationType::MaxLogFileSize) {
      setValue(conf->level(), static_cast<std::size_t>(getULong(conf->value())), &m_maxLogFileSizeMap);
#if !defined(ELPP_NO_DEFAULT_LOG_FILE)
      withFileSizeLimit.push_back(conf);
#endif  // !defined(ELPP_NO_DEFAULT_LOG_FILE)
    } else if (conf->configurationType() == ConfigurationType::LogFlushThreshold) {
      setValue(conf->level(), static_cast<std::size_t>(getULong(conf->value())), &m_logFlushThresholdMap);
    }
  }
  // As mentioned earlier, we will now set filename configuration in separate loop to deal with non-existent files
  for (Configurations::const_iterator it = configurations->begin(); it != configurations->end(); ++it) {
    Configuration* conf = *it;
    if (conf->configurationType() == ConfigurationType::Filename) {
      insertFile(conf->level(), conf->value());
    }
  }
  for (std::vector<Configuration*>::iterator conf = withFileSizeLimit.begin();
       conf != withFileSizeLimit.end(); ++conf) {
    // This is not unsafe as mutex is locked in currect scope
    unsafeValidateFileRolling((*conf)->level(), base::defaultPreRollOutCallback);
  }
}